

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::AJoint::Prepare(AJoint *this,btScalar dt,int iterations)

{
  Body *this_00;
  Body *this_01;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  btTransform *pbVar6;
  btMatrix3x3 *pbVar7;
  btMatrix3x3 *pbVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  btMatrix3x3 r;
  undefined1 auStack_80 [4];
  btScalar local_7c;
  float local_78;
  undefined8 local_74;
  float local_68;
  undefined8 local_64;
  float local_58;
  undefined8 local_54;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [16];
  
  local_7c = dt;
  (**(code **)(*(long *)this->m_icontrol + 0x10))(this->m_icontrol,this);
  this_00 = (this->super_Joint).m_bodies;
  Body::activate(this_00);
  this_01 = (this->super_Joint).m_bodies + 1;
  Body::activate(this_01);
  pbVar6 = Body::xform(this_00);
  fVar15 = (this->super_Joint).m_refs[0].m_floats[0];
  fVar10 = (this->super_Joint).m_refs[0].m_floats[1];
  fVar17 = (this->super_Joint).m_refs[0].m_floats[2];
  auVar3._4_4_ = fVar17 * (pbVar6->m_basis).m_el[1].m_floats[2] +
                 fVar15 * (pbVar6->m_basis).m_el[1].m_floats[0] +
                 (pbVar6->m_basis).m_el[1].m_floats[1] * fVar10;
  auVar3._0_4_ = fVar17 * (pbVar6->m_basis).m_el[0].m_floats[2] +
                 fVar15 * (pbVar6->m_basis).m_el[0].m_floats[0] +
                 (pbVar6->m_basis).m_el[0].m_floats[1] * fVar10;
  auVar3._8_4_ = fVar17 * (pbVar6->m_basis).m_el[2].m_floats[2] +
                 fVar15 * (pbVar6->m_basis).m_el[2].m_floats[0] +
                 fVar10 * (pbVar6->m_basis).m_el[2].m_floats[1];
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])this->m_axis[0].m_floats = auVar3;
  pbVar6 = Body::xform(this_01);
  fVar15 = (this->super_Joint).m_refs[1].m_floats[0];
  fVar10 = (this->super_Joint).m_refs[1].m_floats[1];
  fVar17 = (this->super_Joint).m_refs[1].m_floats[2];
  auVar4._4_4_ = fVar17 * (pbVar6->m_basis).m_el[1].m_floats[2] +
                 fVar15 * (pbVar6->m_basis).m_el[1].m_floats[0] +
                 (pbVar6->m_basis).m_el[1].m_floats[1] * fVar10;
  auVar4._0_4_ = fVar17 * (pbVar6->m_basis).m_el[0].m_floats[2] +
                 fVar15 * (pbVar6->m_basis).m_el[0].m_floats[0] +
                 (pbVar6->m_basis).m_el[0].m_floats[1] * fVar10;
  auVar4._8_4_ = fVar17 * (pbVar6->m_basis).m_el[2].m_floats[2] +
                 fVar15 * (pbVar6->m_basis).m_el[2].m_floats[0] +
                 fVar10 * (pbVar6->m_basis).m_el[2].m_floats[1];
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])this->m_axis[1].m_floats = auVar4;
  fVar15 = this->m_axis[0].m_floats[0];
  fVar10 = this->m_axis[1].m_floats[0];
  uVar12 = *(undefined8 *)(this->m_axis[1].m_floats + 1);
  fVar11 = (float)uVar12;
  fVar14 = (float)((ulong)uVar12 >> 0x20);
  uVar12 = *(undefined8 *)(this->m_axis[0].m_floats + 1);
  fVar18 = (float)uVar12;
  fVar16 = (float)((ulong)uVar12 >> 0x20);
  fVar17 = fVar16 * fVar11 - fVar14 * fVar18;
  fVar19 = fVar15 * fVar14 - fVar10 * fVar16;
  fVar15 = fVar10 * fVar18 - fVar15 * fVar11;
  fVar10 = fVar15 * fVar15 + fVar17 * fVar17 + fVar19 * fVar19;
  if (fVar10 < 0.0) {
    local_38 = ZEXT416((uint)fVar15);
    local_48 = fVar17;
    fStack_44 = fVar19;
    fStack_40 = fVar16 * 0.0 - fVar14 * 0.0;
    fStack_3c = fVar16 * 0.0 - fVar14 * 0.0;
    fVar10 = sqrtf(fVar10);
    fVar15 = (float)local_38._0_4_;
    fVar17 = local_48;
    fVar19 = fStack_44;
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar11 = 0.0;
  uVar12 = 0;
  if (1.1920929e-07 < fVar10) {
    fVar10 = 1.0 / fVar10;
    fVar11 = fVar15 * fVar10;
    uVar12 = CONCAT44(fVar19 * fVar10,fVar17 * fVar10);
  }
  auVar13._8_4_ = fVar11;
  auVar13._0_8_ = uVar12;
  auVar13._12_4_ = 0;
  *(undefined1 (*) [16])(this->super_Joint).m_drift.m_floats = auVar13;
  fVar10 = this->m_axis[0].m_floats[2] * this->m_axis[1].m_floats[2] +
           this->m_axis[0].m_floats[0] * this->m_axis[1].m_floats[0] +
           this->m_axis[0].m_floats[1] * this->m_axis[1].m_floats[1];
  fVar15 = 1.0;
  if (fVar10 <= 1.0) {
    fVar15 = fVar10;
  }
  fVar15 = (float)(-(uint)(fVar10 < -1.0) & 0xbf800000 | ~-(uint)(fVar10 < -1.0) & (uint)fVar15);
  fVar10 = -1.0;
  if (-1.0 <= fVar15) {
    fVar10 = fVar15;
  }
  fVar10 = acosf(fVar10);
  fVar15 = 0.19634955;
  if (fVar10 <= 0.19634955) {
    fVar15 = fVar10;
  }
  fVar10 = (this->super_Joint).m_drift.m_floats[2];
  fVar17 = (this->super_Joint).m_erp / local_7c;
  uVar12 = *(undefined8 *)(this->super_Joint).m_drift.m_floats;
  *(ulong *)(this->super_Joint).m_drift.m_floats =
       CONCAT44(fVar17 * fVar15 * (float)((ulong)uVar12 >> 0x20),fVar17 * fVar15 * (float)uVar12);
  (this->super_Joint).m_drift.m_floats[2] = fVar10 * fVar15 * fVar17;
  pbVar7 = Body::invWorldInertia(this_00);
  pbVar8 = Body::invWorldInertia(this_01);
  lVar9 = 8;
  do {
    uVar12 = *(undefined8 *)((long)pbVar7->m_el[0].m_floats + lVar9 + -8);
    uVar1 = *(undefined8 *)((long)pbVar8->m_el[0].m_floats + lVar9 + -8);
    auVar2._4_4_ = (float)((ulong)uVar1 >> 0x20) + (float)((ulong)uVar12 >> 0x20);
    auVar2._0_4_ = (float)uVar1 + (float)uVar12;
    auVar2._8_4_ = *(float *)((long)pbVar7->m_el[0].m_floats + lVar9) +
                   *(float *)((long)pbVar8->m_el[0].m_floats + lVar9);
    auVar2._12_4_ = 0;
    *(undefined1 (*) [16])(auStack_80 + lVar9) = auVar2;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x38);
  fVar14 = (float)local_64;
  fVar16 = (float)((ulong)local_64 >> 0x20);
  fVar15 = (float)local_54;
  fVar11 = (float)((ulong)local_54 >> 0x20);
  fVar10 = fVar11 * fVar14 - fVar16 * fVar15;
  fVar17 = local_58 * fVar16 - local_68 * fVar11;
  fVar19 = local_68 * fVar15 - local_58 * fVar14;
  fVar23 = (float)local_74;
  fVar21 = (float)((ulong)local_74 >> 0x20);
  fVar22 = 1.0 / (fVar21 * fVar19 + local_78 * fVar10 + fVar23 * fVar17);
  fVar19 = fVar19 * fVar22;
  fVar18 = (fVar15 * fVar21 - fVar11 * fVar23) * fVar22;
  fVar20 = (fVar16 * fVar23 - fVar14 * fVar21) * fVar22;
  fVar10 = fVar10 * fVar22;
  fVar17 = fVar17 * fVar22;
  (this->super_Joint).m_massmatrix.m_el[0].m_floats[0] = fVar10;
  *(ulong *)((this->super_Joint).m_massmatrix.m_el[0].m_floats + 1) = CONCAT44(fVar20,fVar18);
  (this->super_Joint).m_massmatrix.m_el[0].m_floats[3] = 0.0;
  (this->super_Joint).m_massmatrix.m_el[1].m_floats[0] = fVar17;
  *(ulong *)((this->super_Joint).m_massmatrix.m_el[1].m_floats + 1) =
       CONCAT44((fVar21 * local_68 + fVar16 * -local_78) * fVar22,
                (fVar11 * local_78 + -fVar21 * local_58) * fVar22);
  (this->super_Joint).m_massmatrix.m_el[1].m_floats[3] = 0.0;
  (this->super_Joint).m_massmatrix.m_el[2].m_floats[0] = fVar19;
  *(ulong *)((this->super_Joint).m_massmatrix.m_el[2].m_floats + 1) =
       CONCAT44((local_78 * fVar14 + local_68 * -fVar23) * fVar22,
                (local_58 * fVar23 + -local_78 * fVar15) * fVar22);
  (this->super_Joint).m_massmatrix.m_el[2].m_floats[3] = 0.0;
  fVar15 = (this->super_Joint).m_split;
  if (0.0 < fVar15) {
    fVar11 = (this->super_Joint).m_drift.m_floats[2];
    fVar16 = fVar15 * fVar11;
    fVar14 = 1.0 - fVar15;
    uVar12 = *(undefined8 *)(this->super_Joint).m_drift.m_floats;
    fVar21 = (float)uVar12;
    fVar23 = fVar15 * fVar21;
    fVar22 = (float)((ulong)uVar12 >> 0x20);
    fVar15 = fVar22 * fVar15;
    auVar5._4_4_ = fVar16 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[2] +
                   fVar17 * fVar23 + fVar15 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[1];
    auVar5._0_4_ = fVar16 * fVar20 + fVar10 * fVar23 + fVar15 * fVar18;
    auVar5._8_4_ = fVar16 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[2] +
                   fVar15 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[1] + fVar19 * fVar23;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])(this->super_Joint).m_sdrift.m_floats = auVar5;
    *(ulong *)(this->super_Joint).m_drift.m_floats = CONCAT44(fVar14 * fVar22,fVar14 * fVar21);
    (this->super_Joint).m_drift.m_floats[2] = fVar14 * fVar11;
  }
  fVar15 = 1.0 / (float)iterations;
  uVar12 = *(undefined8 *)(this->super_Joint).m_drift.m_floats;
  *(ulong *)(this->super_Joint).m_drift.m_floats =
       CONCAT44(fVar15 * (float)((ulong)uVar12 >> 0x20),fVar15 * (float)uVar12);
  (this->super_Joint).m_drift.m_floats[2] = fVar15 * (this->super_Joint).m_drift.m_floats[2];
  return;
}

Assistant:

void				btSoftBody::AJoint::Prepare(btScalar dt,int iterations)
{
	static const btScalar	maxdrift=SIMD_PI/16;
	m_icontrol->Prepare(this);
	Joint::Prepare(dt,iterations);
	m_axis[0]	=	m_bodies[0].xform().getBasis()*m_refs[0];
	m_axis[1]	=	m_bodies[1].xform().getBasis()*m_refs[1];
	m_drift		=	NormalizeAny(btCross(m_axis[1],m_axis[0]));
	m_drift		*=	btMin(maxdrift,btAcos(Clamp<btScalar>(btDot(m_axis[0],m_axis[1]),-1,+1)));
	m_drift		*=	m_erp/dt;
	m_massmatrix=	AngularImpulseMatrix(m_bodies[0].invWorldInertia(),m_bodies[1].invWorldInertia());
	if(m_split>0)
	{
		m_sdrift	=	m_massmatrix*(m_drift*m_split);
		m_drift		*=	1-m_split;
	}
	m_drift	/=(btScalar)iterations;
}